

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::ndfs::
algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::dfs_red
          (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this,zg_t *ts,
          graph_t *graph,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
          stats_t *stats,node_sptr_t *n)

{
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  *r;
  unsigned_long *puVar1;
  color_t *pcVar2;
  bool *pbVar3;
  _Elt_pointer prVar4;
  node_sptr_t t;
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
  stack;
  undefined1 local_c0 [8];
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  local_b8;
  red_stack_entry_t local_a8;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  *local_90;
  _Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
  ::_M_initialize_map(&local_88,0);
  local_90 = (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
              *)&(graph->
                 super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
                 ).field_0x50;
  tchecker::graph::directed::
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
  ::edges<tchecker::graph::directed::details::outgoing>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              *)(local_c0 + 8),local_90);
  red_stack_entry_t::red_stack_entry_t
            (&local_a8,n,
             (range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
              *)(local_c0 + 8));
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>
            ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>
              *)&local_88,&local_a8);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_a8.end._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_a8.current._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_a8.n);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_b8._end._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
              *)(local_c0 + 8));
  puVar1 = stats_t::visited_states_red(stats);
  *puVar1 = *puVar1 + 1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    r = (range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
         *)(local_c0 + 8);
    do {
      prVar4 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        prVar4 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      if (prVar4[-1].current._edge._t == prVar4[-1].end._edge._t) {
        std::
        deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
        ::pop_back((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
                    *)&local_88);
      }
      else {
        red_stack_entry_t::pick_successor((red_stack_entry_t *)local_c0,(graph_t *)(prVar4 + -1));
        puVar1 = stats_t::visited_transitions_red(stats);
        *puVar1 = *puVar1 + 1;
        if (local_c0 == (undefined1  [8])0x0) {
LAB_00135735:
          __assert_fail("_t != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                        ,0x1db,
                        "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>]"
                       );
        }
        pcVar2 = ndfs::node_t::color((node_t *)local_c0);
        if (*pcVar2 == CYAN) {
          pbVar3 = stats_t::cycle(stats);
          *pbVar3 = true;
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t
                    ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                      *)local_c0);
          break;
        }
        if (local_c0 == (undefined1  [8])0x0) goto LAB_00135735;
        pcVar2 = ndfs::node_t::color((node_t *)local_c0);
        if (*pcVar2 == BLUE) {
          if (local_c0 == (undefined1  [8])0x0) goto LAB_00135735;
          pcVar2 = ndfs::node_t::color((node_t *)local_c0);
          *pcVar2 = RED;
          tchecker::graph::directed::
          graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
          ::edges<tchecker::graph::directed::details::outgoing>
                    ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                      *)r,local_90);
          red_stack_entry_t::red_stack_entry_t(&local_a8,(node_sptr_t *)local_c0,r);
          std::
          deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>
          ::
          emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>
                    ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>
                      *)&local_88,&local_a8);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&local_a8.end._edge);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&local_a8.current._edge);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&local_a8.n);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&local_b8._end._edge);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t
                    ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                      *)r);
          puVar1 = stats_t::visited_states_red(stats);
          *puVar1 = *puVar1 + 1;
        }
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                    *)local_c0);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
  ::~deque((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
            *)&local_88);
  return;
}

Assistant:

void dfs_red(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels, tchecker::algorithms::ndfs::stats_t & stats,
               node_sptr_t & n)
  {
    std::stack<red_stack_entry_t> stack;

    stack.push(red_stack_entry_t{n, graph.outgoing_edges(n)});
    ++stats.visited_states_red();

    while (!stack.empty()) {
      red_stack_entry_t & top = stack.top();
      if (!top.has_successor())
        stack.pop();
      else {
        node_sptr_t t = top.pick_successor(graph);
        ++stats.visited_transitions_red();
        if (t->color() == tchecker::algorithms::ndfs::CYAN) {
          stats.cycle() = true;
          break;
        }
        else if (t->color() == tchecker::algorithms::ndfs::BLUE) {
          t->color() = tchecker::algorithms::ndfs::RED;
          stack.push(red_stack_entry_t{t, graph.outgoing_edges(t)});
          ++stats.visited_states_red();
        }
      }
    }
  }